

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP3Serializer::SerializeMetadataInData
          (BP3Serializer *this,bool updateAbsolutePosition,bool inData)

{
  long *plVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  _func_int *p_Var9;
  uint64_t pgIndexStart;
  long *plVar10;
  long lVar11;
  _func_int *p_Var12;
  size_t __n;
  undefined8 *puVar13;
  long lVar14;
  size_t sVar15;
  size_t *position;
  size_t sVar16;
  uint64_t *puVar17;
  long lVar18;
  vector<char,_std::allocator<char>_> *buffer;
  string local_50;
  
  p_Var12 = (this->super_BP3Base)._vptr_BP3Base[-3];
  uVar5 = *(undefined8 *)(&(this->super_BP3Base).field_0x1a0 + (long)p_Var12);
  lVar6 = *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var12);
  lVar7 = *(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var12);
  plVar10 = *(long **)(&(this->super_BP3Base).field_0x138 + (long)p_Var12);
  uVar3 = *(undefined4 *)(&(this->super_BP3Base).field_0x140 + (long)p_Var12);
  lVar18 = 0;
  if (plVar10 != (long *)0x0) {
    do {
      *(int *)plVar10[5] = ((int)plVar10[6] - (int)(int *)plVar10[5]) + -4;
      plVar1 = plVar10 + 6;
      plVar2 = plVar10 + 5;
      plVar10 = (long *)*plVar10;
      lVar18 = lVar18 + (*plVar1 - *plVar2);
    } while (plVar10 != (long *)0x0);
    p_Var12 = (this->super_BP3Base)._vptr_BP3Base[-3];
  }
  uVar4 = *(undefined4 *)(&(this->super_BP3Base).field_0x178 + (long)p_Var12);
  lVar14 = 0;
  for (puVar13 = *(undefined8 **)(&(this->super_BP3Base).field_0x170 + (long)p_Var12);
      puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
    *(int *)puVar13[5] = (*(int *)(puVar13 + 6) - (int)(int *)puVar13[5]) + -4;
    lVar14 = lVar14 + (puVar13[6] - puVar13[5]);
  }
  if (inData) {
    __n = lVar7 - lVar6;
    p_Var12 = (this->super_BP3Base)._vptr_BP3Base[-3];
    lVar11 = (ulong)*(uint *)(&(this->super_BP3Base).field_0x198 + (long)p_Var12) +
             __n + lVar18 + lVar14 + 0x28;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar8 = *(long *)(&(this->super_BP3Base).field_0x60 + (long)p_Var12);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50," when writing metadata in bp data buffer","");
    BufferSTL::Resize((BufferSTL *)(&(this->super_BP3Base).field_0x30 + (long)p_Var12),
                      lVar8 + lVar11,&local_50);
    buffer = (vector<char,_std::allocator<char>_> *)
             (&(this->super_BP3Base).field_0x70 + (long)p_Var12);
    position = (size_t *)(&(this->super_BP3Base).field_0x60 + (long)p_Var12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *(undefined8 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + *position) = uVar5;
    sVar15 = *position;
    *position = sVar15 + 8;
    *(size_t *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar15 + 8) = __n;
    sVar15 = *position + 8;
    *position = sVar15;
    if (lVar7 != lVar6) {
      memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar15,
              *(void **)(&(this->super_BP3Base).field_0xe8 +
                        (long)(this->super_BP3Base)._vptr_BP3Base[-3]),__n);
      sVar15 = *position;
    }
    *position = sVar15 + __n;
    p_Var9 = (this->super_BP3Base)._vptr_BP3Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar15 + __n) = uVar3;
    sVar15 = *position;
    *position = sVar15 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar15 + 4) = lVar18;
    sVar15 = *position + 8;
    *position = sVar15;
    for (puVar13 = *(undefined8 **)(&(this->super_BP3Base).field_0x138 + (long)p_Var9);
        puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
      sVar16 = puVar13[6] - (long)puVar13[5];
      if (sVar16 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + sVar15,(void *)puVar13[5],sVar16);
        sVar15 = *position;
      }
      sVar15 = sVar15 + sVar16;
      *position = sVar15;
    }
    puVar17 = (uint64_t *)(&(this->super_BP3Base).field_0x68 + (long)p_Var12);
    p_Var12 = (this->super_BP3Base)._vptr_BP3Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar15) = uVar4;
    sVar15 = *position;
    *position = sVar15 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar15 + 4) = lVar14;
    sVar15 = *position + 8;
    *position = sVar15;
    for (puVar13 = *(undefined8 **)(&(this->super_BP3Base).field_0x170 + (long)p_Var12);
        puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
      sVar16 = puVar13[6] - (long)puVar13[5];
      if (sVar16 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + sVar15,(void *)puVar13[5],sVar16);
        sVar15 = *position;
      }
      sVar15 = sVar15 + sVar16;
      *position = sVar15;
    }
    pgIndexStart = *puVar17;
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP3Base).field_0x8,pgIndexStart,
               __n + pgIndexStart + 0x10,lVar18 + __n + pgIndexStart + 0x1c,buffer,position,false);
    if (updateAbsolutePosition) {
      *puVar17 = *puVar17 + lVar11;
    }
    p_Var12 = (this->super_BP3Base)._vptr_BP3Base[-3];
    if ((&(this->super_BP3Base).field_0x2e8)[(long)p_Var12] == '\x01') {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[10],unsigned_long&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(&(this->super_BP3Base).field_0x2b0 + (long)p_Var12),"buffering",puVar17);
    }
  }
  return;
}

Assistant:

void BP3Serializer::SerializeMetadataInData(const bool updateAbsolutePosition, const bool inData)
{
    auto lf_SetIndexCountLength = [](std::unordered_map<std::string, SerialElementIndex> &indices,
                                     uint32_t &count, uint64_t &length) {
        count = static_cast<uint32_t>(indices.size());
        length = 0;
        for (auto &indexPair : indices) // set each index length
        {
            auto &indexBuffer = indexPair.second.Buffer;
            const uint32_t indexLength = static_cast<uint32_t>(indexBuffer.size() - 4);
            size_t indexLengthPosition = 0;
            helper::CopyToBuffer(indexBuffer, indexLengthPosition, &indexLength);

            length += indexBuffer.size(); // overall length
        }
    };

    auto lf_FlattenIndices = [](const uint32_t count, const uint64_t length,
                                const std::unordered_map<std::string, SerialElementIndex> &indices,
                                std::vector<char> &buffer, size_t &position) {
        helper::CopyToBuffer(buffer, position, &count);
        helper::CopyToBuffer(buffer, position, &length);

        for (const auto &indexPair : indices) // set each index length
        {
            const auto &indexBuffer = indexPair.second.Buffer;
            helper::CopyToBuffer(buffer, position, indexBuffer.data(), indexBuffer.size());
        }
    };

    // Finish writing metadata counts and lengths
    // PG Index
    const uint64_t pgCount = m_MetadataSet.DataPGCount;
    const uint64_t pgLength = m_MetadataSet.PGIndex.Buffer.size();

    // var index count and length (total), and each index length
    uint32_t varsCount = 0;
    uint64_t varsLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.VarsIndices, varsCount, varsLength);

    // attribute index count and length, and each index length
    uint32_t attributesCount = 0;
    uint64_t attributesLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.AttributesIndices, attributesCount, attributesLength);

    if (!inData)
    {
        return;
    }

    const size_t footerSize =
        static_cast<size_t>((pgLength + 16) + (varsLength + 12) + (attributesLength + 12) +
                            m_MetadataSet.MiniFooterSize);

    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // reserve data to fit metadata,
    // must replace with growth buffer strategy?
    m_Data.Resize(position + footerSize, " when writing metadata in bp data buffer");

    // write pg index
    helper::CopyToBuffer(buffer, position, &pgCount);
    helper::CopyToBuffer(buffer, position, &pgLength);
    helper::CopyToBuffer(buffer, position, m_MetadataSet.PGIndex.Buffer.data(),
                         static_cast<size_t>(pgLength));

    // Vars indices
    lf_FlattenIndices(varsCount, varsLength, m_MetadataSet.VarsIndices, buffer, position);
    // Attribute indices
    lf_FlattenIndices(attributesCount, attributesLength, m_MetadataSet.AttributesIndices, buffer,
                      position);

    // getting absolute offset start, minifooter is 28 bytes for now
    const uint64_t pgIndexStart = static_cast<uint64_t>(absolutePosition);
    const uint64_t variablesIndexStart = static_cast<uint64_t>(pgIndexStart + (pgLength + 16));
    const uint64_t attributesIndexStart =
        static_cast<uint64_t>(variablesIndexStart + (varsLength + 12));

    PutMinifooter(pgIndexStart, variablesIndexStart, attributesIndexStart, buffer, position);

    if (updateAbsolutePosition)
    {
        absolutePosition += footerSize;
    }

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.emplace("buffering", absolutePosition);
    }
}